

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesNode.cpp
# Opt level: O2

void __thiscall
chrono::ChVariablesNode::Compute_inc_Mb_v
          (ChVariablesNode *this,ChVectorRef *result,ChVectorConstRef vect)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  uint __line;
  int iVar6;
  Scalar *pSVar7;
  char *__assertion;
  CoeffReturnType CVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  lVar5 = *(long *)&(result->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).field_0x8;
  iVar6 = (*(this->super_ChVariables)._vptr_ChVariables[2])();
  if (lVar5 == iVar6) {
    lVar5 = (vect->
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ).
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            .m_rows.m_value;
    iVar6 = (*(this->super_ChVariables)._vptr_ChVariables[2])(this);
    if (lVar5 == iVar6) {
      dVar1 = this->mass;
      CVar8 = Eigen::
              DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                            *)vect,0);
      pSVar7 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                             *)result,0);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dVar1;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = CVar8;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *pSVar7;
      auVar2 = vfmadd213sd_fma(auVar12,auVar9,auVar2);
      *pSVar7 = auVar2._0_8_;
      dVar1 = this->mass;
      CVar8 = Eigen::
              DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                            *)vect,1);
      pSVar7 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                             *)result,1);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar1;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = CVar8;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *pSVar7;
      auVar2 = vfmadd213sd_fma(auVar13,auVar10,auVar3);
      *pSVar7 = auVar2._0_8_;
      dVar1 = this->mass;
      CVar8 = Eigen::
              DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                            *)vect,2);
      pSVar7 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                             *)result,2);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar1;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = CVar8;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *pSVar7;
      auVar2 = vfmadd213sd_fma(auVar14,auVar11,auVar4);
      *pSVar7 = auVar2._0_8_;
      return;
    }
    __assertion = "vect.size() == Get_ndof()";
    __line = 0x41;
  }
  else {
    __assertion = "result.size() == Get_ndof()";
    __line = 0x40;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesNode.cpp"
                ,__line,
                "virtual void chrono::ChVariablesNode::Compute_inc_Mb_v(ChVectorRef, ChVectorConstRef) const"
               );
}

Assistant:

void ChVariablesNode::Compute_inc_Mb_v(ChVectorRef result, ChVectorConstRef vect) const {
    assert(result.size() == Get_ndof());
    assert(vect.size() == Get_ndof());

    // optimized unrolled operations
    result(0) += mass * vect(0);
    result(1) += mass * vect(1);
    result(2) += mass * vect(2);
}